

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

back_insert_iterator<std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<int,_int,_int,_int,_int>,_testing::internal::CastAndAppendTransform<const_int_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>_>
::IterateOverTuple<std::tuple<int,_int,_int,_int,_int>,_3UL>::operator()
          (undefined8 param_1,long param_2,
          vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>> *param_3
          )

{
  back_insert_iterator<std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
  bVar1;
  MatcherBase<const_int_&> local_30;
  
  Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&local_30,(int *)(param_2 + 8));
  std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>::
  emplace_back<testing::Matcher<int_const&>>(param_3,(Matcher<const_int_&> *)&local_30);
  MatcherBase<const_int_&>::~MatcherBase(&local_30);
  bVar1 = IterateOverTuple<std::tuple<int,_int,_int,_int,_int>,_2UL>::operator()
                    ((IterateOverTuple<std::tuple<int,_int,_int,_int,_int>,_2UL> *)&local_30,param_2
                     ,param_3);
  return (back_insert_iterator<std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }